

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall
TPZMatrix<std::complex<float>_>::Decompose_LDLt(TPZMatrix<std::complex<float>_> *this)

{
  byte bVar1;
  bool bVar2;
  complex<float> a;
  int k_1;
  ulong uVar3;
  ulong uVar4;
  int k;
  ulong uVar5;
  long lVar6;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  float extraout_XMM0_Da_07;
  float extraout_XMM0_Da_08;
  undefined4 extraout_XMM0_Da_09;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  float extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  float extraout_XMM0_Db_07;
  float extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Db_09;
  complex<float> val;
  complex<float> tmp;
  float local_78;
  float fStack_74;
  complex<float> local_60;
  complex<float> local_58;
  long local_50;
  ulong local_48;
  ulong local_40;
  complex<float> local_38;
  
  bVar1 = (this->super_TPZBaseMatrix).fDecomposed;
  if (bVar1 != 0) {
    if (bVar1 == 4) {
      return (uint)bVar1;
    }
    Error("Decompose_LDLt <Matrix already Decomposed with other scheme> ",(char *)0x0);
  }
  uVar3 = (this->super_TPZBaseMatrix).fRow;
  if (uVar3 != (this->super_TPZBaseMatrix).fCol) {
    Error("Decompose_LDLt <Matrix must be square>",(char *)0x0);
    uVar3 = (this->super_TPZBaseMatrix).fRow;
  }
  uVar4 = 0;
  local_48 = 0;
  if (0 < (int)uVar3) {
    local_48 = uVar3 & 0xffffffff;
  }
  local_50 = 1;
  local_40 = uVar3;
  for (; uVar4 != local_48; uVar4 = uVar4 + 1) {
    local_78 = 0.0;
    fStack_74 = 0.0;
    for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,uVar5,uVar5);
      val._M_value = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,uVar5,uVar4);
      local_58._M_value = CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00) ^ 0x8000000000000000;
      std::operator*(&val,&local_58);
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,uVar5,uVar4);
      local_60._M_value = CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
      std::operator*(&tmp,&local_60);
      local_78 = local_78 + extraout_XMM0_Da_02;
      fStack_74 = fStack_74 + extraout_XMM0_Db_02;
    }
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,uVar4,uVar4);
    tmp._M_value = CONCAT44(extraout_XMM0_Db_03 - fStack_74,extraout_XMM0_Da_03 - local_78);
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])(this,uVar4,uVar4,&tmp);
    a._M_value = (_ComplexT)this;
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,uVar4,uVar4);
    bVar2 = IsZero(a);
    lVar6 = local_50;
    if (bVar2) {
      Error("Decompose_LDLt <Zero on diagonal>",(char *)0x0);
      lVar6 = local_50;
    }
    for (; (int)lVar6 < (int)uVar3; lVar6 = lVar6 + 1) {
      local_78 = 0.0;
      fStack_74 = 0.0;
      for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,uVar3,uVar3);
        local_58._M_value = CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,uVar4,uVar3);
        local_60._M_value = CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05) ^ 0x8000000000000000;
        std::operator*(&local_58,&local_60);
        val._M_value = CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar6,uVar3);
        std::operator*(&val,&local_38);
        local_78 = local_78 + extraout_XMM0_Da_07;
        fStack_74 = fStack_74 + extraout_XMM0_Db_07;
      }
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar6,uVar4);
      local_58._M_value = CONCAT44(extraout_XMM0_Db_08 - fStack_74,extraout_XMM0_Da_08 - local_78);
      std::operator/(&local_58,&tmp);
      val._M_value = CONCAT44(extraout_XMM0_Db_09,extraout_XMM0_Da_09);
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])(this,lVar6,uVar4,&val);
      val._M_value = val._M_value ^ 0x8000000000000000;
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])(this,uVar4,lVar6,&val);
      uVar3 = local_40;
    }
    local_50 = local_50 + 1;
  }
  (this->super_TPZBaseMatrix).fDecomposed = '\x04';
  (this->super_TPZBaseMatrix).fDefPositive = '\0';
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Decompose_LDLt() {
	
	if (  fDecomposed && fDecomposed != ELDLt) {
		Error( "Decompose_LDLt <Matrix already Decomposed with other scheme> " );
	} else if(fDecomposed ) {
		return ELDLt;
	}
	if ( Rows()!=Cols() ) Error( "Decompose_LDLt <Matrix must be square>" );
	
	const int dim=Rows();
	
	for (auto j = 0; j < dim; j++ ) {
        TVar sum = 0;
		for (auto k=0; k<j; k++) {
            if constexpr(is_complex<TVar>::value){
                sum +=GetVal(k,k)*std::conj(GetVal(k,j))*GetVal(k,j);
            }else{
                sum +=GetVal(k,k)*GetVal(k,j)*GetVal(k,j);
            }   
		}
        PutVal( j,j,GetVal(j,j) - sum );
		TVar tmp = GetVal(j,j);
		if ( IsZero(tmp) ) Error( "Decompose_LDLt <Zero on diagonal>" );
        for(auto l=j+1; l<dim;l++) {
            TVar sum = 0;
            for (auto k=0; k<j; k++) {
                if constexpr(is_complex<TVar>::value){
                    sum += GetVal(k,k)*std::conj(GetVal(j,k))*GetVal(l,k);
                }else{
                    sum += GetVal(k,k)*GetVal(j,k)*GetVal(l,k);
                }
			}
            TVar val = (GetVal(l,j) - sum)/tmp;
            PutVal(l,j,val);
            if constexpr(is_complex<TVar>::value){val=std::conj(val);}
            PutVal(j,l,val);
		}
	}
	fDecomposed  = ELDLt;
	fDefPositive = 0;
	return( 1 );
}